

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessDomain
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  char cVar1;
  pointer pbVar2;
  bool bVar3;
  Status SVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  string *psVar8;
  Interpreter *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  pointer pbVar9;
  string *psVar10;
  writer wVar11;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_string_checker<char> local_288;
  string local_250;
  StringArray *local_230;
  writer write;
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  domains;
  Value local_1e8;
  json json;
  string_t local_190;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_170;
  undefined1 local_160 [64];
  undefined1 local_120 [40];
  undefined1 local_f8 [40];
  undefined1 local_d0 [40];
  undefined1 local_a8 [40];
  undefined1 local_80 [40];
  undefined1 local_58 [40];
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  pbVar9 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (long)(aExpr->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9;
  if (uVar5 < 0x21) {
    local_288._0_8_ = (ulong)(uint)local_288._4_4_ << 0x20;
    local_288.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "too few arguments";
    local_288.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
    local_288.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_288.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_288.parse_funcs_[0] = (parse_func)0x0;
    pcVar6 = "too few arguments";
    local_288.context_.types_ = local_288.types_;
    while (pcVar7 = pcVar6, pcVar7 != "") {
      pcVar6 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",&local_288);
      }
    }
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_288;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_250,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    psVar10 = (string *)(local_58 + 8);
    local_58._0_4_ = kInvalidArgs;
    std::__cxx11::string::string(psVar10,(string *)&local_250);
    Value::Value(&local_1e8,(Error *)local_58);
LAB_00190c89:
    Value::operator=(__return_storage_ptr__,&local_1e8);
    Value::~Value(&local_1e8);
    std::__cxx11::string::~string(psVar10);
    std::__cxx11::string::~string((string *)&local_250);
    return __return_storage_ptr__;
  }
  if (uVar5 != 0x40) {
    local_288._0_8_ = (ulong)(uint)local_288._4_4_ << 0x20;
    local_288.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "too many arguments";
    local_288.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x12;
    local_288.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_288.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_288.parse_funcs_[0] = (parse_func)0x0;
    pcVar6 = "too many arguments";
    local_288.context_.types_ = local_288.types_;
    while (pcVar7 = pcVar6, pcVar7 != "") {
      pcVar6 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",&local_288);
      }
    }
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&local_288;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_250,(v10 *)"too many arguments",(string_view)ZEXT816(0x12),args_00);
    psVar10 = (string *)(local_80 + 8);
    local_80._0_4_ = kInvalidArgs;
    std::__cxx11::string::string(psVar10,(string *)&local_250);
    Value::Value(&local_1e8,(Error *)local_80);
    goto LAB_00190c89;
  }
  std::__cxx11::string::string((string *)&local_1e8,"list",(allocator *)&local_288);
  bVar3 = CaseInsensitiveEqual(pbVar9 + 1,(string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  if (!bVar3) {
    local_288.types_[0] = string_type;
    local_288.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "\'{}\' is not a valid sub-command";
    local_288.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1f;
    local_288.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_288.context_.super_basic_format_parse_context<char>._20_4_ = 1;
    local_288.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
    pcVar6 = "\'{}\' is not a valid sub-command";
    local_288.context_.types_ = local_288.types_;
    while (pcVar7 = pcVar6, pcVar7 != "") {
      pcVar6 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar7,"",&local_288);
      }
    }
    pbVar9 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_288._0_8_ = pbVar9[1]._M_dataplus._M_p;
    local_288.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         (char *)pbVar9[1]._M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x1f;
    args_01.field_1.args_ = in_R9.args_;
    args_01.desc_ = (unsigned_long_long)&local_288;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_250,(v10 *)"\'{}\' is not a valid sub-command",fmt,args_01);
    psVar10 = (string *)(local_120 + 8);
    local_120._0_4_ = kInvalidCommand;
    std::__cxx11::string::string(psVar10,(string *)&local_250);
    Value::Value(&local_1e8,(Error *)local_120);
    goto LAB_00190c89;
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&json,(nullptr_t)0x0);
  domains.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  domains.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  domains.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_230 = &(this->mContext).mDomAliases;
  pbVar9 = (this->mContext).mDomAliases.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->mContext).mDomAliases.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
LAB_001909f8:
  if (pbVar9 != pbVar2) {
    bVar3 = std::operator==(pbVar9,"all");
    if ((!bVar3) && (bVar3 = std::operator==(pbVar9,"other"), !bVar3)) goto code_r0x00190a27;
    local_288.types_[0] = string_type;
    local_288.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "alias \'{}\' not supported by the command";
    local_288.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x27;
    local_288.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_288.context_.super_basic_format_parse_context<char>._20_4_ = 1;
    local_288.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
    pcVar6 = "alias \'{}\' not supported by the command";
    local_288.context_.types_ = local_288.types_;
    write.handler_ = &local_288;
    while (pcVar6 != "") {
      cVar1 = *pcVar6;
      pcVar7 = pcVar6;
      while (cVar1 != '{') {
        pcVar7 = pcVar7 + 1;
        if (pcVar7 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()(&write,pcVar6,"");
          goto LAB_00190d70;
        }
        cVar1 = *pcVar7;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()(&write,pcVar6,pcVar7);
      pcVar6 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                         (pcVar7,"",&local_288);
    }
LAB_00190d70:
    local_288._0_8_ = (pbVar9->_M_dataplus)._M_p;
    local_288.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         (char *)pbVar9->_M_string_length;
    fmt_00.size_ = 0xd;
    fmt_00.data_ = (char *)0x27;
    args_02.field_1.args_ = in_R9.args_;
    args_02.desc_ = (unsigned_long_long)&local_288;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_250,(v10 *)"alias \'{}\' not supported by the command",fmt_00,args_02);
    psVar10 = (string *)(local_a8 + 8);
    local_a8._0_4_ = kInvalidArgs;
    std::__cxx11::string::string(psVar10,(string *)&local_250);
    Value::Value(&local_1e8,(Error *)local_a8);
    goto LAB_00190dc5;
  }
  if ((this->mContext).mDomAliases.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->mContext).mDomAliases.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    SVar4 = persistent_storage::Registry::GetAllDomains
                      ((this->mRegistry).
                       super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,&domains);
    if (SVar4 < kDataInvalid) goto LAB_00191059;
    local_288._0_8_ = local_288._0_8_ & 0xffffffff00000000;
    local_288.context_.super_basic_format_parse_context<char>.format_str_.data_ = "lookup failed";
    local_288.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0xd;
    local_288.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_288.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_288.parse_funcs_[0] = (parse_func)0x0;
    pcVar6 = "lookup failed";
    local_288.context_.types_ = local_288.types_;
    while (pcVar7 = pcVar6, pcVar7 != "") {
      pcVar6 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",&local_288);
      }
    }
    args_04.field_1.args_ = in_R9.args_;
    args_04.desc_ = (unsigned_long_long)&local_288;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_250,(v10 *)"lookup failed",(string_view)ZEXT816(0xd),args_04);
    psVar10 = (string *)(local_f8 + 8);
    local_f8._0_4_ = kRegistryError;
    std::__cxx11::string::string(psVar10,(string *)&local_250);
    Value::Value(&local_1e8,(Error *)local_f8);
LAB_00190dc5:
    Value::operator=(__return_storage_ptr__,&local_1e8);
    Value::~Value(&local_1e8);
    std::__cxx11::string::~string(psVar10);
    psVar8 = &local_250;
  }
  else {
    write.handler_ = (format_string_checker<char> *)0x0;
    SVar4 = persistent_storage::Registry::GetDomainsByAliases
                      ((this->mRegistry).
                       super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,local_230,&domains,(StringArray *)&write);
    local_230 = (StringArray *)CONCAT71(local_230._1_7_,SVar4);
    psVar8 = (string *)(local_160 + 0x20);
    for (wVar11 = write; wVar11.handler_ != (format_string_checker<char> *)0x0;
        wVar11.handler_ = (format_string_checker<char> *)&((wVar11.handler_)->context_).types_) {
      std::__cxx11::string::string((string *)psVar8,(string *)wVar11.handler_);
      this_00 = (Interpreter *)local_160;
      std::__cxx11::string::string((string *)local_160,"failed to resolve",(allocator *)&local_1e8);
      PrintNetworkMessage(this_00,psVar8,(string *)local_160,kYellow);
      std::__cxx11::string::~string((string *)local_160);
      std::__cxx11::string::~string((string *)psVar8);
    }
    if ((char)local_230 != '\0') {
      local_288._0_8_ = local_288._0_8_ & 0xffffffff00000000;
      local_288.context_.super_basic_format_parse_context<char>.format_str_.data_ = "lookup failed";
      local_288.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0xd;
      local_288.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_288.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_288.parse_funcs_[0] = (parse_func)0x0;
      pcVar6 = "lookup failed";
      local_288.context_.types_ = local_288.types_;
      while (pcVar7 = pcVar6, pcVar7 != "") {
        pcVar6 = pcVar7 + 1;
        if (*pcVar7 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar7 + 2;
        }
        else if (*pcVar7 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar7,"",&local_288);
        }
      }
      args_03.field_1.args_ = in_R9.args_;
      args_03.desc_ = (unsigned_long_long)&local_288;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_250,(v10 *)"lookup failed",(string_view)ZEXT816(0xd),args_03);
      local_d0._0_4_ = kRegistryError;
      std::__cxx11::string::string((string *)(local_d0 + 8),(string *)&local_250);
      Value::Value(&local_1e8,(Error *)local_d0);
      Value::operator=(__return_storage_ptr__,&local_1e8);
      Value::~Value(&local_1e8);
      std::__cxx11::string::~string((string *)(local_d0 + 8));
      std::__cxx11::string::~string((string *)&local_250);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&write);
      goto LAB_00190df2;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&write);
LAB_00191059:
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    basic_json<std::vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>_&,_std::vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>,_0>
              (&local_170,&domains);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=(&json,&local_170);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_170);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump(&local_190,&json,4,' ',false,strict);
    Value::Value(&local_1e8,&local_190);
    Value::operator=(__return_storage_ptr__,&local_1e8);
    Value::~Value(&local_1e8);
    psVar8 = &local_190;
  }
  std::__cxx11::string::~string((string *)psVar8);
LAB_00190df2:
  std::
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ::~vector(&domains);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&json);
  return __return_storage_ptr__;
code_r0x00190a27:
  pbVar9 = pbVar9 + 1;
  goto LAB_001909f8;
}

Assistant:

Interpreter::Value Interpreter::ProcessDomain(const Expression &aExpr)
{
    using namespace ot::commissioner::persistent_storage;

    Value value;

    VerifyOrExit(aExpr.size() > 1, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    VerifyOrExit(aExpr.size() == 2, value = ERROR_INVALID_ARGS(SYNTAX_MANY_ARGS));
    if (CaseInsensitiveEqual(aExpr[1], "list"))
    {
        RegistryStatus      status;
        nlohmann::json      json;
        std::vector<Domain> domains;

        for (const auto &alias : mContext.mDomAliases)
        {
            if (alias == ALIAS_ALL || alias == ALIAS_OTHERS)
            {
                ExitNow(value = ERROR_INVALID_ARGS("alias '{}' not supported by the command", alias));
            }
        }
        if (mContext.mDomAliases.size() != 0)
        {
            StringArray unresolved;
            status = mRegistry->GetDomainsByAliases(mContext.mDomAliases, domains, unresolved);
            for (const auto &alias : unresolved)
            {
                PrintNetworkMessage(alias, RUNTIME_RESOLVING_FAILED, COLOR_ALIAS_FAILED);
            }
            VerifyOrExit(status == RegistryStatus::kSuccess, value = ERROR_REGISTRY_ERROR(RUNTIME_LOOKUP_FAILED));
        }
        else
        {
            status = mRegistry->GetAllDomains(domains);
            if (status != RegistryStatus::kSuccess && status != RegistryStatus::kNotFound)
            {
                ExitNow(value = ERROR_REGISTRY_ERROR(RUNTIME_LOOKUP_FAILED));
            }
        }
        json  = domains;
        value = json.dump(JSON_INDENT_DEFAULT);
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

exit:
    return value;
}